

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O3

void __thiscall QVariant::load(QVariant *this,QDataStream *s)

{
  undefined1 *puVar1;
  __atomic_base<int> _Var2;
  ulong uVar3;
  PrivateShared *pPVar4;
  int *piVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  QMetaType QVar9;
  ulong uVar10;
  storage_type *extraout_RDX;
  char *pcVar11;
  long in_FS_OFFSET;
  QByteArrayView typeName;
  QByteArrayView typeName_00;
  qint8 is_null;
  quint32 typeId;
  QMessageLogger local_68;
  QByteArray local_48;
  byte local_25;
  __atomic_base<int> local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  clear(this);
  local_24._M_i = 0xaaaaaaaa;
  QDataStream::operator>>(s,&local_24._M_i);
  uVar8 = s->ver;
  if ((int)uVar8 < 7) {
    if (0x23 < (ulong)(uint)local_24._M_i) goto LAB_002ce05f;
    local_24._M_i = (__int_type_conflict)mapIdFromQt3ToCurrent[(uint)local_24._M_i];
LAB_002cde90:
    if (local_24._M_i == 0x400) {
LAB_002cde98:
      local_24._M_i = 0x10000;
    }
    else {
LAB_002cdebc:
      if (local_24._M_i - 0x40U < 0x18) {
        local_24._M_i = local_24._M_i + 0xfc0;
      }
      else if (local_24._M_i == 0x1b) {
        typeName.m_data._0_4_ = local_24._M_i - 0x40U;
        typeName.m_size = (qsizetype)"QRegExp";
        typeName.m_data._4_4_ = 0;
        QVar9 = QMetaType::fromName((QMetaType *)&DAT_00000007,typeName);
        if (QVar9.d_ptr == (QMetaTypeInterface *)0x0) {
          uVar7 = 0;
        }
        else {
          uVar7 = ((QVar9.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
          if (uVar7 == 0) {
            uVar7 = QMetaType::registerHelper(QVar9.d_ptr);
          }
        }
        uVar8 = s->ver;
        local_24._M_i = uVar7;
      }
      else if (local_24._M_i == 0x79) goto LAB_002cdeda;
    }
LAB_002cdf14:
    local_25 = 0;
    if (7 < (int)uVar8) goto LAB_002cdf1e;
  }
  else {
    if (uVar8 < 0xd) {
      if (local_24._M_i == 0x7f) goto LAB_002cde98;
      if (local_24._M_i != 0x400 && 0x7f < (uint)local_24._M_i) {
        local_24._M_i = local_24._M_i - 0x61;
        goto LAB_002cde90;
      }
      if (local_24._M_i != 0x4b) {
        if (10 < local_24._M_i - 0x4cU) goto LAB_002cde90;
        local_24._M_i = local_24._M_i - 1;
        goto LAB_002cdebc;
      }
LAB_002cdeda:
      local_24._M_i = 0x2000;
      goto LAB_002cdf14;
    }
    if (uVar8 < 0x14) goto LAB_002cde90;
LAB_002cdf1e:
    local_25 = 0;
    QDataStream::operator>>(s,(qint8 *)&local_25);
  }
  if (local_24._M_i == 0x10000) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = (char *)0x0;
    local_48.d.size = 0;
    ::operator>>(s,&local_48);
    typeName_00.m_data = extraout_RDX;
    typeName_00.m_size = (qsizetype)local_48.d.ptr;
    QVar9 = QMetaType::fromName((QMetaType *)local_48.d.size,typeName_00);
    if (QVar9.d_ptr == (QMetaTypeInterface *)0x0) {
      local_24._M_i = 0;
    }
    else {
      _Var2._M_i = ((QVar9.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
      if ((_Var2._M_i != 0) ||
         (local_24._M_i = QMetaType::registerHelper(QVar9.d_ptr), _Var2._M_i = local_24._M_i,
         local_24._M_i != 0)) {
        local_24._M_i = _Var2._M_i;
        if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
          }
        }
        goto LAB_002cdfb2;
      }
    }
    QDataStream::setStatus(s,ReadCorruptData);
    local_68.context.version = 2;
    local_68.context.line = 0;
    local_68.context.file._0_4_ = 0;
    local_68.context.file._4_4_ = 0;
    local_68.context.function._0_4_ = 0;
    local_68.context.function._4_4_ = 0;
    local_68.context.category = "default";
    pcVar11 = local_48.d.ptr;
    if (local_48.d.ptr == (char *)0x0) {
      pcVar11 = &QByteArray::_empty;
    }
    QMessageLogger::warning(&local_68,"QVariant::load: unknown user type with name %s.",pcVar11);
    load();
  }
  else {
LAB_002cdfb2:
    create(this,local_24._M_i,(void *)0x0);
    puVar1 = &(this->d).field_0x18;
    uVar3 = *(ulong *)&(this->d).field_0x18;
    uVar10 = (uVar3 & 0xfffffffffffffffd) + (ulong)(local_25 & 1) * 2;
    *(ulong *)&(this->d).field_0x18 = uVar10;
    if (uVar3 < 4) {
      if (s->ver < 0xd) {
        local_68.context.version = 0;
        local_68.context.line = 0;
        local_68.context.file._0_4_ = 0;
        local_68.context.file._4_4_ = 0;
        local_68.context.function._0_4_ = 0;
        local_68.context.function._4_4_ = 0;
        ::operator>>(s,(QString *)&local_68);
        piVar5 = (int *)CONCAT44(local_68.context.line,local_68.context.version);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT44(local_68.context.line,local_68.context.version),2,0x10
                      );
          }
        }
        uVar10 = *(ulong *)puVar1;
      }
      *(ulong *)puVar1 = uVar10 | 2;
    }
    else {
      if ((uVar3 & 1) != 0) {
        pPVar4 = (this->d).data.shared;
        this = (QVariant *)
               ((long)&(pPVar4->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                       _q_value.super___atomic_base<int> + (long)pPVar4->offset);
      }
      local_68.context.version = (int)(uVar3 & 0xfffffffffffffffc);
      local_68.context.line = (int)((uVar3 & 0xfffffffffffffffc) >> 0x20);
      bVar6 = QMetaType::load((QMetaType *)&local_68,s,this);
      if (!bVar6) {
        load();
      }
    }
  }
LAB_002ce05f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QVariant::load(QDataStream &s)
{
    clear();

    quint32 typeId;
    s >> typeId;
    if (s.version() < QDataStream::Qt_4_0) {
        // map to Qt 5 ids
        if (typeId >= MapFromThreeCount)
            return;
        typeId = mapIdFromQt3ToCurrent[typeId];
    } else if (s.version() < QDataStream::Qt_5_0) {
        // map to Qt 5 type ids
        if (typeId == 127 /* QVariant::UserType */) {
            typeId = Qt5UserType;
        } else if (typeId >= 128 && typeId != Qt5UserType) {
            // In Qt4 id == 128 was FirstExtCoreType. In Qt5 ExtCoreTypes set was merged to CoreTypes
            // by moving all ids down by 97.
            typeId -= 97;
        } else if (typeId == 75 /* QSizePolicy */) {
            typeId = Qt5SizePolicy;
        } else if (typeId > 75 && typeId <= 86) {
            // and as a result these types received lower ids too
            // QKeySequence QPen QTextLength QTextFormat QTransform QMatrix4x4 QVector2D QVector3D QVector4D QQuaternion
            typeId -=1;
        }
    }
    if (s.version() < QDataStream::Qt_6_0) {
        // map from Qt 5 to Qt 6 values
        if (typeId == Qt5UserType) {
            typeId = QMetaType::User;
        } else if (typeId >= Qt5FirstGuiType && typeId <= Qt5LastGuiType) {
            typeId += Qt6ToQt5GuiTypeDelta;
        } else if (typeId == Qt5SizePolicy) {
            typeId = QMetaType::QSizePolicy;
        } else if (typeId == Qt5RegExp) {
            typeId = QMetaType::fromName("QRegExp").id();
        }
    }

    qint8 is_null = false;
    if (s.version() >= QDataStream::Qt_4_2)
        s >> is_null;
    if (typeId == QMetaType::User) {
        QByteArray name;
        s >> name;
        typeId = QMetaType::fromName(name).id();
        if (typeId == QMetaType::UnknownType) {
            s.setStatus(QDataStream::ReadCorruptData);
            qWarning("QVariant::load: unknown user type with name %s.", name.constData());
            return;
        }
    }
    create(typeId, nullptr);
    d.is_null = is_null;

    if (!isValid()) {
        if (s.version() < QDataStream::Qt_5_0) {
            // Since we wrote something, we should read something
            QString x;
            s >> x;
        }
        d.is_null = true;
        return;
    }

    // const cast is safe since we operate on a newly constructed variant
    void *data = const_cast<void *>(constData());
    if (!d.type().load(s, data)) {
        s.setStatus(QDataStream::ReadCorruptData);
        qWarning("QVariant::load: unable to load type %d.", d.type().id());
    }
}